

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O1

void h2v2_smooth_downsample
               (j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
               JSAMPARRAY output_data)

{
  uint uVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  JSAMPROW pJVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  
  iVar17 = compptr->DCT_h_scaled_size * compptr->width_in_blocks;
  iVar6 = cinfo->max_v_samp_factor;
  if (-2 < iVar6) {
    uVar1 = cinfo->image_width;
    iVar15 = iVar17 * 2;
    if (0 < (int)(iVar15 - uVar1)) {
      uVar18 = 0;
      do {
        memset(input_data[uVar18 - 1] + uVar1,(uint)input_data[uVar18 - 1][(ulong)uVar1 - 1],
               (ulong)(iVar15 + ~uVar1) + 1);
        uVar18 = uVar18 + 1;
      } while (iVar6 + 2 != uVar18);
    }
  }
  if (0 < cinfo->max_v_samp_factor) {
    iVar6 = cinfo->smoothing_factor * 0x10;
    iVar15 = cinfo->smoothing_factor * -0x50 + 0x4000;
    iVar17 = iVar17 + -2;
    lVar7 = 0;
    lVar9 = 0;
    do {
      pbVar2 = input_data[lVar9 + -1];
      pbVar3 = input_data[lVar9];
      pbVar4 = input_data[lVar9 + 1];
      pbVar5 = input_data[lVar9 + 2];
      pJVar14 = output_data[lVar7];
      *pJVar14 = (JSAMPLE)(((uint)pbVar4[1] + (uint)pbVar3[1] + (uint)*pbVar4 + (uint)*pbVar3) *
                           iVar15 + ((uint)*pbVar5 * 3 + (uint)*pbVar2 * 3 +
                                     (uint)pbVar5[2] + (uint)pbVar2[2] +
                                    (uint)pbVar5[1] * 2 + (uint)pbVar3[2] * 2 +
                                    (uint)pbVar2[1] * 2 + ((uint)*pbVar4 + (uint)*pbVar3) * 2 +
                                    (uint)pbVar4[2] * 2) * iVar6 + 0x8000 >> 0x10);
      pbVar13 = pbVar3 + 2;
      pbVar12 = pbVar4 + 2;
      pbVar10 = pbVar2 + 2;
      pbVar11 = pbVar5 + 2;
      pJVar14 = pJVar14 + 1;
      if (iVar17 != 0) {
        lVar16 = 0;
        iVar8 = iVar17;
        do {
          *pJVar14 = (JSAMPLE)(iVar6 * ((uint)pbVar5[lVar16 + 1] +
                                        (uint)pbVar2[lVar16 + 4] + (uint)pbVar2[lVar16 + 1] +
                                        ((uint)pbVar4[lVar16 + 4] +
                                        (uint)pbVar4[lVar16 + 1] +
                                        (uint)pbVar3[lVar16 + 4] + (uint)pbVar3[lVar16 + 1] +
                                        (uint)pbVar5[lVar16 + 3] + (uint)pbVar11[lVar16] +
                                        (uint)pbVar2[lVar16 + 3] + (uint)pbVar10[lVar16]) * 2 +
                                       (uint)pbVar5[lVar16 + 4]) +
                               iVar15 * ((uint)pbVar4[lVar16 + 3] + (uint)pbVar12[lVar16] +
                                        (uint)pbVar3[lVar16 + 3] + (uint)pbVar13[lVar16]) + 0x8000
                              >> 0x10);
          pJVar14 = pJVar14 + 1;
          lVar16 = lVar16 + 2;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        pbVar11 = pbVar11 + lVar16;
        pbVar10 = pbVar10 + lVar16;
        pbVar12 = pbVar12 + lVar16;
        pbVar13 = pbVar13 + lVar16;
      }
      *pJVar14 = (JSAMPLE)(((uint)pbVar11[1] * 3 + (uint)pbVar10[1] * 3 +
                            (uint)pbVar11[-1] + (uint)pbVar10[-1] +
                           (uint)*pbVar11 * 2 + (uint)pbVar13[-1] * 2 +
                           (uint)*pbVar10 * 2 + ((uint)pbVar12[1] + (uint)pbVar13[1]) * 2 +
                           (uint)pbVar12[-1] * 2) * iVar6 +
                           ((uint)*pbVar12 + (uint)*pbVar13 + (uint)pbVar12[1] + (uint)pbVar13[1]) *
                           iVar15 + 0x8000 >> 0x10);
      lVar9 = lVar9 + 2;
      lVar7 = lVar7 + 1;
    } while (lVar9 < cinfo->max_v_samp_factor);
  }
  return;
}

Assistant:

METHODDEF(void)
h2v2_smooth_downsample (j_compress_ptr cinfo, jpeg_component_info * compptr,
			JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int inrow, outrow;
  JDIMENSION colctr;
  JDIMENSION output_cols = compptr->width_in_blocks * compptr->DCT_h_scaled_size;
  register JSAMPROW inptr0, inptr1, above_ptr, below_ptr, outptr;
  INT32 membersum, neighsum, memberscale, neighscale;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data - 1, cinfo->max_v_samp_factor + 2,
		    cinfo->image_width, output_cols * 2);

  /* We don't bother to form the individual "smoothed" input pixel values;
   * we can directly compute the output which is the average of the four
   * smoothed values.  Each of the four member pixels contributes a fraction
   * (1-8*SF) to its own smoothed image and a fraction SF to each of the three
   * other smoothed pixels, therefore a total fraction (1-5*SF)/4 to the final
   * output.  The four corner-adjacent neighbor pixels contribute a fraction
   * SF to just one smoothed pixel, or SF/4 to the final output; while the
   * eight edge-adjacent neighbors contribute SF to each of two smoothed
   * pixels, or SF/2 overall.  In order to use integer arithmetic, these
   * factors are scaled by 2^16 = 65536.
   * Also recall that SF = smoothing_factor / 1024.
   */

  memberscale = 16384 - cinfo->smoothing_factor * 80; /* scaled (1-5*SF)/4 */
  neighscale = cinfo->smoothing_factor * 16; /* scaled SF/4 */

  inrow = outrow = 0;
  while (inrow < cinfo->max_v_samp_factor) {
    outptr = output_data[outrow];
    inptr0 = input_data[inrow];
    inptr1 = input_data[inrow+1];
    above_ptr = input_data[inrow-1];
    below_ptr = input_data[inrow+2];

    /* Special case for first column: pretend column -1 is same as column 0 */
    membersum = GETJSAMPLE(*inptr0) + GETJSAMPLE(inptr0[1]) +
		GETJSAMPLE(*inptr1) + GETJSAMPLE(inptr1[1]);
    neighsum = GETJSAMPLE(*above_ptr) + GETJSAMPLE(above_ptr[1]) +
	       GETJSAMPLE(*below_ptr) + GETJSAMPLE(below_ptr[1]) +
	       GETJSAMPLE(*inptr0) + GETJSAMPLE(inptr0[2]) +
	       GETJSAMPLE(*inptr1) + GETJSAMPLE(inptr1[2]);
    neighsum += neighsum;
    neighsum += GETJSAMPLE(*above_ptr) + GETJSAMPLE(above_ptr[2]) +
		GETJSAMPLE(*below_ptr) + GETJSAMPLE(below_ptr[2]);
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr++ = (JSAMPLE) ((membersum + 32768) >> 16);
    inptr0 += 2; inptr1 += 2; above_ptr += 2; below_ptr += 2;

    for (colctr = output_cols - 2; colctr > 0; colctr--) {
      /* sum of pixels directly mapped to this output element */
      membersum = GETJSAMPLE(*inptr0) + GETJSAMPLE(inptr0[1]) +
		  GETJSAMPLE(*inptr1) + GETJSAMPLE(inptr1[1]);
      /* sum of edge-neighbor pixels */
      neighsum = GETJSAMPLE(*above_ptr) + GETJSAMPLE(above_ptr[1]) +
		 GETJSAMPLE(*below_ptr) + GETJSAMPLE(below_ptr[1]) +
		 GETJSAMPLE(inptr0[-1]) + GETJSAMPLE(inptr0[2]) +
		 GETJSAMPLE(inptr1[-1]) + GETJSAMPLE(inptr1[2]);
      /* The edge-neighbors count twice as much as corner-neighbors */
      neighsum += neighsum;
      /* Add in the corner-neighbors */
      neighsum += GETJSAMPLE(above_ptr[-1]) + GETJSAMPLE(above_ptr[2]) +
		  GETJSAMPLE(below_ptr[-1]) + GETJSAMPLE(below_ptr[2]);
      /* form final output scaled up by 2^16 */
      membersum = membersum * memberscale + neighsum * neighscale;
      /* round, descale and output it */
      *outptr++ = (JSAMPLE) ((membersum + 32768) >> 16);
      inptr0 += 2; inptr1 += 2; above_ptr += 2; below_ptr += 2;
    }

    /* Special case for last column */
    membersum = GETJSAMPLE(*inptr0) + GETJSAMPLE(inptr0[1]) +
		GETJSAMPLE(*inptr1) + GETJSAMPLE(inptr1[1]);
    neighsum = GETJSAMPLE(*above_ptr) + GETJSAMPLE(above_ptr[1]) +
	       GETJSAMPLE(*below_ptr) + GETJSAMPLE(below_ptr[1]) +
	       GETJSAMPLE(inptr0[-1]) + GETJSAMPLE(inptr0[1]) +
	       GETJSAMPLE(inptr1[-1]) + GETJSAMPLE(inptr1[1]);
    neighsum += neighsum;
    neighsum += GETJSAMPLE(above_ptr[-1]) + GETJSAMPLE(above_ptr[1]) +
		GETJSAMPLE(below_ptr[-1]) + GETJSAMPLE(below_ptr[1]);
    membersum = membersum * memberscale + neighsum * neighscale;
    *outptr = (JSAMPLE) ((membersum + 32768) >> 16);

    inrow += 2;
    outrow++;
  }
}